

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_print.c
# Opt level: O3

void cmd_print_help(void)

{
  puts(
      "Usage: print [-f (yang | yin | tree [-q -P PATH -L LINE_LENGTH ] | info [-q -P PATH])]\n            [-o OUTFILE] [<module-name1>[@revision]] ...\n                  Print a schema module. The <module-name> is not required\n                  only in case the -P option is specified. For yang, yin and tree\n                  formats, a submodule can also be printed.\n\n  -f FORMAT, --format=FORMAT\n                  Print the module in the specified FORMAT. If format not\n                  specified, the \'tree\' format is used.\n  -L LINE_LENGTH, --tree-line-length=LINE_LENGTH\n                 The limit of the maximum line length on which the \'tree\'\n                 format will try to be printed.\n  -P PATH, --schema-node=PATH\n                 Print only the specified subtree of the schema.\n                 The PATH is the XPath subset mentioned in documentation as\n                 the Path format. The option can be combined with --single-node\n                 option to print information only about the specified node.\n  -q, --single-node\n                 Supplement to the --schema-node option to print information\n                 only about a single node specified as PATH argument.\n  -o OUTFILE, --output=OUTFILE\n                  Write the output to OUTFILE instead of stdout."
      );
  return;
}

Assistant:

void
cmd_print_help(void)
{
    printf("Usage: print [-f (yang | yin | tree [-q -P PATH -L LINE_LENGTH ] | info [-q -P PATH])]\n"
            "            [-o OUTFILE] [<module-name1>[@revision]] ...\n"
            "                  Print a schema module. The <module-name> is not required\n"
            "                  only in case the -P option is specified. For yang, yin and tree\n"
            "                  formats, a submodule can also be printed.\n\n"
            "  -f FORMAT, --format=FORMAT\n"
            "                  Print the module in the specified FORMAT. If format not\n"
            "                  specified, the 'tree' format is used.\n"
            "  -L LINE_LENGTH, --tree-line-length=LINE_LENGTH\n"
            "                 The limit of the maximum line length on which the 'tree'\n"
            "                 format will try to be printed.\n"
            "  -P PATH, --schema-node=PATH\n"
            "                 Print only the specified subtree of the schema.\n"
            "                 The PATH is the XPath subset mentioned in documentation as\n"
            "                 the Path format. The option can be combined with --single-node\n"
            "                 option to print information only about the specified node.\n"
            "  -q, --single-node\n"
            "                 Supplement to the --schema-node option to print information\n"
            "                 only about a single node specified as PATH argument.\n"
            "  -o OUTFILE, --output=OUTFILE\n"
            "                  Write the output to OUTFILE instead of stdout.\n");
}